

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::AdvancedIndirectAddressingCase2::Run(AdvancedIndirectAddressingCase2 *this)

{
  bool bVar1;
  GLuint GVar2;
  GLint GVar3;
  Vector<float,_3> local_218;
  Vector<float,_3> local_20c;
  Vector<float,_3> local_200;
  Vector<float,_3> local_1f4;
  Vector<float,_3> local_1e8;
  Vector<float,_3> local_1dc;
  Vector<float,_3> local_1d0;
  Vector<float,_3> local_1c4;
  Vector<float,_3> local_1b8;
  Vector<float,_3> local_1ac;
  Vector<float,_3> local_1a0;
  Vector<float,_3> local_194;
  Vector<float,_3> local_188;
  Vector<float,_3> local_17c;
  Vector<float,_3> local_170;
  Vector<float,_3> local_164;
  Vector<float,_3> local_158;
  Vector<float,_3> local_14c;
  Vector<float,_3> local_140;
  Vector<float,_3> local_134;
  undefined8 local_128;
  float data_2 [8];
  uint local_fc;
  undefined4 local_f8;
  GLuint i_1;
  float data_1 [4] [4];
  uint local_ac;
  GLuint i;
  float data [4] [2];
  string local_80;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *glsl_fs;
  char *glsl_vs;
  AdvancedIndirectAddressingCase2 *this_local;
  
  glsl_vs = (char *)this;
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,4)
  ;
  if (bVar1) {
    glsl_fs = 
    "\nlayout(location = 1) in vec2 g_in_position;\nlayout(binding = 0, std430) buffer Transform {\n  vec2 translation;\n} g_transform[4];\nuniform uint g_transform_id = 2;\nvoid main() {\n  gl_Position = vec4(g_in_position + g_transform[g_transform_id].translation, 0, 1);\n}"
    ;
    local_28 = 
    "\nlayout(location = 0) out vec4 g_fs_out;\nlayout(binding = 4, std430) buffer Material {\n  vec3 color;\n} g_material[4];\nuniform int g_material_id = 1;\nvoid main() {\n  g_fs_out = vec4(g_material[g_material_id].color, 1);\n}"
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "\nlayout(location = 1) in vec2 g_in_position;\nlayout(binding = 0, std430) buffer Transform {\n  vec2 translation;\n} g_transform[4];\nuniform uint g_transform_id = 2;\nvoid main() {\n  gl_Position = vec4(g_in_position + g_transform[g_transform_id].translation, 0, 1);\n}"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,
               "\nlayout(location = 0) out vec4 g_fs_out;\nlayout(binding = 4, std430) buffer Material {\n  vec3 color;\n} g_material[4];\nuniform int g_material_id = 1;\nvoid main() {\n  g_fs_out = vec4(g_material[g_material_id].color, 1);\n}"
               ,(allocator<char> *)((long)data[3] + 7));
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_48,&local_80);
    this->m_program = GVar2;
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)((long)data[3] + 7));
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    if (bVar1) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,8,this->m_storage_buffer);
      data[0][0] = 0.5;
      data[0][1] = -0.5;
      data[1][0] = -0.5;
      data[1][1] = 0.5;
      data[2][0] = 0.5;
      data[2][1] = 0.5;
      for (local_ac = 0; local_ac < 4; local_ac = local_ac + 1) {
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,local_ac,this->m_storage_buffer[local_ac]);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,8,data + ((ulong)local_ac - 1),0x88e8);
      }
      memset(&local_f8,0,0x40);
      local_f8 = 0x3f800000;
      data_1[0][3] = 1.0;
      data_1[2][0] = 1.0;
      data_1[2][2] = 1.0;
      data_1[2][3] = 1.0;
      for (local_fc = 0; local_fc < 4; local_fc = local_fc + 1) {
        glu::CallLogWrapper::glBindBufferBase
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,local_fc + 4,this->m_storage_buffer[local_fc + 4]);
        glu::CallLogWrapper::glBufferData
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,0x90d2,0x10,&local_f8 + (ulong)local_fc * 4,0x88e8);
      }
      local_128 = 0xbecccccdbecccccd;
      data_2[0] = 0.4;
      data_2[1] = -0.4;
      data_2[2] = -0.4;
      data_2[3] = 0.4;
      data_2[4] = 0.4;
      data_2[5] = 0.4;
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_buffer);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glBufferData
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0x20,&local_128,0x88e4);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0);
      glu::CallLogWrapper::glBindTexture
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,this->m_rt);
      glu::CallLogWrapper::glTexParameteri
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0x2801,0x2601);
      glu::CallLogWrapper::glTexParameteri
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0x2800,0x2601);
      glu::CallLogWrapper::glTexStorage2D
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,1,0x8058,100,100);
      glu::CallLogWrapper::glBindTexture
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0xde1,0);
      glu::CallLogWrapper::glViewport
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0,0,100,100);
      glu::CallLogWrapper::glBindFramebuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8d40,this->m_fbo);
      glu::CallLogWrapper::glFramebufferTexture
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8d40,0x8ce0,this->m_rt,0);
      glu::CallLogWrapper::glGenVertexArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_vertex_array);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,this->m_vertex_buffer);
      glu::CallLogWrapper::glVertexAttribPointer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,2,0x1406,'\0',0,(void *)0x0);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8892,0);
      glu::CallLogWrapper::glEnableVertexAttribArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0);
      glu::CallLogWrapper::glUseProgram
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_program);
      glu::CallLogWrapper::glBindVertexArray
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->m_vertex_array);
      glu::CallLogWrapper::glClear
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x4000);
      glu::CallLogWrapper::glDrawArrays
                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,5,0,4);
      tcu::Vector<float,_3>::Vector(&local_134,0.0);
      tcu::Vector<float,_3>::Vector(&local_140,0.0);
      tcu::Vector<float,_3>::Vector(&local_14c,0.0);
      tcu::Vector<float,_3>::Vector(&local_158,0.0,1.0,0.0);
      bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                        (&this->super_ShaderStorageBufferObjectBase,&local_134,&local_140,&local_14c
                         ,&local_158,(int *)0x0);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        GVar3 = glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                            super_GLWrapper.super_CallLogWrapper,this->m_program,"g_transform_id");
        glu::CallLogWrapper::glUniform1ui
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,0);
        GVar3 = glu::CallLogWrapper::glGetUniformLocation
                          (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                            super_GLWrapper.super_CallLogWrapper,this->m_program,"g_material_id");
        glu::CallLogWrapper::glUniform1i
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,GVar3,2);
        glu::CallLogWrapper::glDrawArrays
                  (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,5,0,4);
        tcu::Vector<float,_3>::Vector(&local_164,0.0,0.0,1.0);
        tcu::Vector<float,_3>::Vector(&local_170,0.0);
        tcu::Vector<float,_3>::Vector(&local_17c,0.0);
        tcu::Vector<float,_3>::Vector(&local_188,0.0,1.0,0.0);
        bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                          (&this->super_ShaderStorageBufferObjectBase,&local_164,&local_170,
                           &local_17c,&local_188,(int *)0x0);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          GVar3 = glu::CallLogWrapper::glGetUniformLocation
                            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper,this->m_program,"g_transform_id")
          ;
          glu::CallLogWrapper::glUniform1ui
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,GVar3,1);
          GVar3 = glu::CallLogWrapper::glGetUniformLocation
                            (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                              super_GLWrapper.super_CallLogWrapper,this->m_program,"g_material_id");
          glu::CallLogWrapper::glUniform1i
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,GVar3,3);
          glu::CallLogWrapper::glDrawArraysInstanced
                    (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
                      super_CallLogWrapper,5,0,4,1);
          tcu::Vector<float,_3>::Vector(&local_194,0.0,0.0,1.0);
          tcu::Vector<float,_3>::Vector(&local_1a0,1.0,1.0,0.0);
          tcu::Vector<float,_3>::Vector(&local_1ac,0.0);
          tcu::Vector<float,_3>::Vector(&local_1b8,0.0,1.0,0.0);
          bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                            (&this->super_ShaderStorageBufferObjectBase,&local_194,&local_1a0,
                             &local_1ac,&local_1b8,(int *)0x0);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            GVar3 = glu::CallLogWrapper::glGetUniformLocation
                              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                super_GLWrapper.super_CallLogWrapper,this->m_program,
                               "g_transform_id");
            glu::CallLogWrapper::glUniform1ui
                      (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,GVar3,3);
            GVar3 = glu::CallLogWrapper::glGetUniformLocation
                              (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                super_GLWrapper.super_CallLogWrapper,this->m_program,"g_material_id"
                              );
            glu::CallLogWrapper::glUniform1i
                      (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,GVar3,0);
            glu::CallLogWrapper::glDrawArrays
                      (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                        super_GLWrapper.super_CallLogWrapper,5,0,4);
            tcu::Vector<float,_3>::Vector(&local_1c4,0.0,0.0,1.0);
            tcu::Vector<float,_3>::Vector(&local_1d0,1.0,1.0,0.0);
            tcu::Vector<float,_3>::Vector(&local_1dc,1.0,0.0,0.0);
            tcu::Vector<float,_3>::Vector(&local_1e8,0.0,1.0,0.0);
            bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                              (&this->super_ShaderStorageBufferObjectBase,&local_1c4,&local_1d0,
                               &local_1dc,&local_1e8,(int *)0x0);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              glu::CallLogWrapper::glClear
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,0x4000);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,this->m_program,
                                 "g_transform_id");
              glu::CallLogWrapper::glUniform1ui
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,GVar3,2);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,this->m_program,
                                 "g_material_id");
              glu::CallLogWrapper::glUniform1i
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,GVar3,1);
              glu::CallLogWrapper::glDrawArrays
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,5,0,4);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,this->m_program,
                                 "g_transform_id");
              glu::CallLogWrapper::glUniform1ui
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,GVar3,0);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,this->m_program,
                                 "g_material_id");
              glu::CallLogWrapper::glUniform1i
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,GVar3,2);
              glu::CallLogWrapper::glDrawArrays
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,5,0,4);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,this->m_program,
                                 "g_transform_id");
              glu::CallLogWrapper::glUniform1ui
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,GVar3,1);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,this->m_program,
                                 "g_material_id");
              glu::CallLogWrapper::glUniform1i
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,GVar3,3);
              glu::CallLogWrapper::glDrawArrays
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,5,0,4);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,this->m_program,
                                 "g_transform_id");
              glu::CallLogWrapper::glUniform1ui
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,GVar3,3);
              GVar3 = glu::CallLogWrapper::glGetUniformLocation
                                (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                                  super_GLWrapper.super_CallLogWrapper,this->m_program,
                                 "g_material_id");
              glu::CallLogWrapper::glUniform1i
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,GVar3,0);
              glu::CallLogWrapper::glBindBufferBase
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,0x90d2,4,this->m_storage_buffer[7]);
              glu::CallLogWrapper::glDrawArrays
                        (&(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.
                          super_GLWrapper.super_CallLogWrapper,5,0,4);
              tcu::Vector<float,_3>::Vector(&local_1f4,0.0,0.0,1.0);
              tcu::Vector<float,_3>::Vector(&local_200,1.0,1.0,0.0);
              tcu::Vector<float,_3>::Vector(&local_20c,1.0,1.0,0.0);
              tcu::Vector<float,_3>::Vector(&local_218,0.0,1.0,0.0);
              bVar1 = ShaderStorageBufferObjectBase::ValidateWindow4Quads
                                (&this->super_ShaderStorageBufferObjectBase,&local_1f4,&local_200,
                                 &local_20c,&local_218,(int *)0x0);
              if (((bVar1 ^ 0xffU) & 1) == 0) {
                this_local = (AdvancedIndirectAddressingCase2 *)0x0;
              }
              else {
                this_local = (AdvancedIndirectAddressingCase2 *)&DAT_ffffffffffffffff;
              }
            }
            else {
              this_local = (AdvancedIndirectAddressingCase2 *)&DAT_ffffffffffffffff;
            }
          }
          else {
            this_local = (AdvancedIndirectAddressingCase2 *)&DAT_ffffffffffffffff;
          }
        }
        else {
          this_local = (AdvancedIndirectAddressingCase2 *)&DAT_ffffffffffffffff;
        }
      }
      else {
        this_local = (AdvancedIndirectAddressingCase2 *)&DAT_ffffffffffffffff;
      }
    }
    else {
      this_local = (AdvancedIndirectAddressingCase2 *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (AdvancedIndirectAddressingCase2 *)0x10;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(4))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(location = 1) in vec2 g_in_position;" NL "layout(binding = 0, std430) buffer Transform {" NL
			   "  vec2 translation;" NL "} g_transform[4];" NL "uniform uint g_transform_id = 2;" NL "void main() {" NL
			   "  gl_Position = vec4(g_in_position + g_transform[g_transform_id].translation, 0, 1);" NL "}";

		const char* const glsl_fs =
			NL "layout(location = 0) out vec4 g_fs_out;" NL "layout(binding = 4, std430) buffer Material {" NL
			   "  vec3 color;" NL "} g_material[4];" NL "uniform int g_material_id = 1;" NL "void main() {" NL
			   "  g_fs_out = vec4(g_material[g_material_id].color, 1);" NL "}";
		m_program = CreateProgram(glsl_vs, glsl_fs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(8, m_storage_buffer);

		/* transform buffers */
		{
			const float data[4][2] = { { -0.5f, -0.5f }, { 0.5f, -0.5f }, { -0.5f, 0.5f }, { 0.5f, 0.5f } };

			for (GLuint i = 0; i < 4; ++i)
			{
				glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i, m_storage_buffer[i]);
				glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data[i]), data[i], GL_DYNAMIC_DRAW);
			}
		}
		/* material buffers */
		{
			const float data[4][4] = { { 1.0f, 0.0f, 0.0f, 0.0f },
									   { 0.0f, 1.0f, 0.0f, 0.0f },
									   { 0.0f, 0.0f, 1.0f, 0.0f },
									   { 1.0f, 1.0f, 0.0f, 0.0f } };
			for (GLuint i = 0; i < 4; ++i)
			{
				glBindBufferBase(GL_SHADER_STORAGE_BUFFER, i + 4, m_storage_buffer[i + 4]);
				glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data[i]), data[i], GL_DYNAMIC_DRAW);
			}
		}

		/* vertex buffer */
		{
			const float data[] = { -0.4f, -0.4f, 0.4f, -0.4f, -0.4f, 0.4f, 0.4f, 0.4f };
			glGenBuffers(1, &m_vertex_buffer);
			glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
			glBufferData(GL_ARRAY_BUFFER, sizeof(data), data, GL_STATIC_DRAW);
			glBindBuffer(GL_ARRAY_BUFFER, 0);
		}

		glBindTexture(GL_TEXTURE_2D, m_rt);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
		glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 100, 100);
		glBindTexture(GL_TEXTURE_2D, 0);
		glViewport(0, 0, 100, 100);
		glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
		glFramebufferTexture(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, m_rt, 0);

		glGenVertexArrays(1, &m_vertex_array);
		glBindVertexArray(m_vertex_array);
		glBindBuffer(GL_ARRAY_BUFFER, m_vertex_buffer);
		glVertexAttribPointer(1, 2, GL_FLOAT, GL_FALSE, 0, 0);
		glBindBuffer(GL_ARRAY_BUFFER, 0);
		glEnableVertexAttribArray(1);
		glBindVertexArray(0);

		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);

		glClear(GL_COLOR_BUFFER_BIT);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateWindow4Quads(vec3(0), vec3(0), vec3(0), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 2);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateWindow4Quads(vec3(0, 0, 1), vec3(0), vec3(0), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 1);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 3);
		glDrawArraysInstanced(GL_TRIANGLE_STRIP, 0, 4, 1);
		if (!ValidateWindow4Quads(vec3(0, 0, 1), vec3(1, 1, 0), vec3(0), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 3);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 0);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		if (!ValidateWindow4Quads(vec3(0, 0, 1), vec3(1, 1, 0), vec3(1, 0, 0), vec3(0, 1, 0)))
		{
			return ERROR;
		}

		// once again with only one validation at the end
		glClear(GL_COLOR_BUFFER_BIT);
		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 2);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 1);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 0);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 2);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 1);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 3);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		glUniform1ui(glGetUniformLocation(m_program, "g_transform_id"), 3);
		glUniform1i(glGetUniformLocation(m_program, "g_material_id"), 0);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[7]);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		if (!ValidateWindow4Quads(vec3(0, 0, 1), vec3(1, 1, 0), vec3(1, 1, 0), vec3(0, 1, 0)))
		{
			return ERROR;
		}
		return NO_ERROR;
	}